

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O1

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  secp256k1_scalar *r_00;
  secp256k1_scalar sVar4;
  
  *r = 0;
  lVar3 = 0;
  iVar1 = 0;
  sVar4 = 0;
  do {
    sVar4 = (uint)b32[lVar3] | sVar4 << 8;
    if (0xc < sVar4) {
      iVar1 = 1;
      sVar4 = sVar4 - (sVar4 / 0xd + (sVar4 / 0xd) * 0xc);
    }
    *r = sVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  if (overflow != (int *)0x0) {
    *overflow = iVar1;
    secp256k1_scalar_verify(r);
    return;
  }
  if (*r < 0xd) {
    return;
  }
  secp256k1_scalar_verify_cold_1();
  secp256k1_scalar_verify((secp256k1_scalar *)b32);
  secp256k1_scalar_verify(r_00);
  uVar2 = *r_00 * *(secp256k1_scalar *)b32;
  *r = uVar2 - (uVar2 / 0xd + (uVar2 / 0xd) * 0xc);
  secp256k1_scalar_verify(r);
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int i;
    int over = 0;
    *r = 0;
    for (i = 0; i < 32; i++) {
        *r = (*r * 0x100) + b32[i];
        if (*r >= EXHAUSTIVE_TEST_ORDER) {
            over = 1;
            *r %= EXHAUSTIVE_TEST_ORDER;
        }
    }
    if (overflow) *overflow = over;

    SECP256K1_SCALAR_VERIFY(r);
}